

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int decode_block(jpeg *j,short *data,huffman *hdc,huffman *hac,int b)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined2 *in_RSI;
  long in_RDI;
  int in_R8D;
  int rs;
  int s;
  int r;
  int t;
  int k;
  int dc;
  int diff;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  uint in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  int local_38;
  int local_4;
  
  iVar1 = decode((jpeg *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 (huffman *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (iVar1 < 0) {
    local_4 = e("Corrupt JPEG");
  }
  else {
    memset(in_RSI,0,0x80);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = extend_receive((jpeg *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                             in_stack_ffffffffffffffb4);
    }
    iVar2 = *(int *)(in_RDI + (long)in_R8D * 0x48 + 0x35d8) + iVar1;
    *(int *)(in_RDI + (long)in_R8D * 0x48 + 0x35d8) = iVar2;
    *in_RSI = (short)iVar2;
    local_38 = 1;
    do {
      in_stack_ffffffffffffffb8 =
           decode((jpeg *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                  (huffman *)CONCAT44(iVar1,in_stack_ffffffffffffffb0));
      if ((int)in_stack_ffffffffffffffb8 < 0) {
        iVar1 = e("Corrupt JPEG");
        return iVar1;
      }
      in_stack_ffffffffffffffbc = in_stack_ffffffffffffffb8 & 0xf;
      if (in_stack_ffffffffffffffbc == 0) {
        if (in_stack_ffffffffffffffb8 != 0xf0) break;
        local_38 = local_38 + 0x10;
      }
      else {
        iVar2 = ((int)in_stack_ffffffffffffffb8 >> 4) + local_38;
        iVar3 = extend_receive((jpeg *)(CONCAT44(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb8
                                                ) & 0xfffffffff),iVar1);
        local_38 = iVar2 + 1;
        in_RSI[dezigzag[iVar2]] = (short)iVar3;
      }
    } while (local_38 < 0x40);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int decode_block(jpeg *j, short data[64], huffman *hdc, huffman *hac, int b)
{
   int diff,dc,k;
   int t = decode(j, hdc);
   if (t < 0) return e("bad huffman code","Corrupt JPEG");

   // 0 all the ac values now so we can do it 32-bits at a time
   memset(data,0,64*sizeof(data[0]));

   diff = t ? extend_receive(j, t) : 0;
   dc = j->img_comp[b].dc_pred + diff;
   j->img_comp[b].dc_pred = dc;
   data[0] = (short) dc;

   // decode AC components, see JPEG spec
   k = 1;
   do {
      int r,s;
      int rs = decode(j, hac);
      if (rs < 0) return e("bad huffman code","Corrupt JPEG");
      s = rs & 15;
      r = rs >> 4;
      if (s == 0) {
         if (rs != 0xf0) break; // end block
         k += 16;
      } else {
         k += r;
         // decode into unzigzag'd location
         data[dezigzag[k++]] = (short) extend_receive(j,s);
      }
   } while (k < 64);
   return 1;
}